

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::LeftoverBuffer::append
          (LeftoverBuffer *this,string_view from)

{
  uint uVar1;
  size_type sVar2;
  char *failure_msg;
  LogMessage *pLVar3;
  const_pointer src;
  LogMessage local_50;
  Voidify local_39;
  unsigned_long local_38;
  unsigned_long local_30;
  Nullable<const_char_*> local_28;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  LeftoverBuffer *this_local;
  string_view from_local;
  
  from_local._M_len = (size_t)from._M_str;
  this_local = (LeftoverBuffer *)from._M_len;
  uVar1 = this->size;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)this;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  local_30 = absl::lts_20250127::log_internal::GetReferenceableValue(uVar1 + sVar2);
  local_38 = absl::lts_20250127::log_internal::GetReferenceableValue(4);
  local_28 = absl::lts_20250127::log_internal::Check_LEImpl<unsigned_long,unsigned_long>
                       (&local_30,&local_38,"size + from.size() <= kUtfMax");
  if (local_28 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_28);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc"
               ,0xff,failure_msg);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar3);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  uVar1 = this->size;
  src = std::basic_string_view<char,_std::char_traits<char>_>::data
                  ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  UnrolledMemcpy(this->buffer + uVar1,src,sVar2);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  this->size = this->size + (int)sVar2;
  return;
}

Assistant:

void LeftoverBuffer::append(absl::string_view from) {
  ABSL_DCHECK_LE(size + from.size(), kUtfMax);

  UnrolledMemcpy(buffer + size, from.data(), from.size());
  size += from.size();
}